

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

string * __thiscall
lest::to_string<char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,char **lhs,string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  long *plVar2;
  ulong *puVar3;
  char **txt;
  ostringstream os;
  ulong *local_218;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string_abi_cxx11_(&local_1d8,this,txt);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,*lhs,(long)lhs[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::operator+(&local_1b8,"\"",op);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar3) {
    local_208 = *puVar3;
    lStack_200 = plVar2[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar3;
    local_218 = (ulong *)*plVar2;
  }
  local_1f0 = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_218 == &local_208) {
    lStack_1e0 = lStack_200;
    local_1f8 = &local_1e8;
  }
  else {
    local_1f8 = local_218;
  }
  local_1e8 = local_208;
  local_208 = local_208 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1f8,local_1f0);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_208;
  *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_200;
  __return_storage_ptr__->_M_string_length = 0;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}